

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink6.c
# Opt level: O3

void Shr_ManComputeTruths
               (Gia_Man_t *p,int nVars,Vec_Int_t *vDivs,Vec_Wrd_t *vDivTruths,Vec_Wrd_t *vTruths)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  word Entry;
  long lVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  word *pwVar8;
  ulong uVar9;
  ulong uVar10;
  
  vDivTruths->nSize = 0;
  uVar10 = (ulong)(uint)nVars;
  if (0 < nVars) {
    pwVar8 = Truth;
    uVar9 = 0;
    do {
      if ((long)vDivs->nSize <= (long)uVar9) goto LAB_007cfb24;
      iVar1 = vDivs->pArray[uVar9];
      if (((long)iVar1 < 0) || (vTruths->nSize <= iVar1)) goto LAB_007cfae6;
      Entry = *pwVar8;
      vTruths->pArray[iVar1] = Entry;
      Vec_WrdPush(vDivTruths,Entry);
      uVar9 = uVar9 + 1;
      pwVar8 = pwVar8 + 1;
    } while (uVar10 != uVar9);
  }
  if (nVars < vDivs->nSize) {
    do {
      if (nVars < 0) {
LAB_007cfb24:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar2 = vDivs->pArray[uVar10];
      lVar5 = (long)(int)uVar2;
      if ((lVar5 < 0) || (p->nObjs <= (int)uVar2)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      lVar4 = *(long *)(p->pObjs + lVar5);
      uVar6 = uVar2 - ((uint)lVar4 & 0x1fffffff);
      if (((((int)uVar6 < 0) || (uVar3 = vTruths->nSize, (int)uVar3 <= (int)uVar6)) ||
          (uVar7 = uVar2 - ((uint)((ulong)lVar4 >> 0x20) & 0x1fffffff), (int)uVar7 < 0)) ||
         (uVar3 <= uVar7)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                      ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
      }
      if (uVar3 <= uVar2) {
LAB_007cfae6:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                      ,0x1cf,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
      }
      pwVar8 = vTruths->pArray;
      uVar9 = ((lVar4 << 2) >> 0x3f ^ pwVar8[uVar7]) &
              ((long)((int)((uint)lVar4 * 4) >> 0x1f) ^ pwVar8[uVar6]);
      pwVar8[lVar5] = uVar9;
      Vec_WrdPush(vDivTruths,uVar9);
      uVar10 = uVar10 + 1;
    } while ((int)uVar10 < vDivs->nSize);
  }
  return;
}

Assistant:

void Shr_ManComputeTruths( Gia_Man_t * p, int nVars, Vec_Int_t * vDivs, Vec_Wrd_t * vDivTruths, Vec_Wrd_t * vTruths )
{
    Gia_Obj_t * pObj;
    word Truth0, Truth1;//, Truthh;
    int i, iDiv;
    Vec_WrdClear( vDivTruths );
    Vec_IntForEachEntryStop( vDivs, iDiv, i, nVars )
    {
        Vec_WrdWriteEntry( vTruths, iDiv, Truth[i] );
        Vec_WrdPush( vDivTruths, Truth[i] );
    }
    Vec_IntForEachEntryStart( vDivs, iDiv, i, nVars )
    {
        pObj = Gia_ManObj( p, iDiv );
        Truth0 = Vec_WrdEntry( vTruths, Gia_ObjFaninId0(pObj, iDiv) );
        Truth1 = Vec_WrdEntry( vTruths, Gia_ObjFaninId1(pObj, iDiv) );
        if ( Gia_ObjFaninC0(pObj) )
            Truth0 = ~Truth0;
        if ( Gia_ObjFaninC1(pObj) )
            Truth1 = ~Truth1;
        Vec_WrdWriteEntry( vTruths, iDiv, Truth0 & Truth1 );
        Vec_WrdPush( vDivTruths, Truth0 & Truth1 );

//        Truthh = Truth0 & Truth1;
//        Abc_TtPrintBinary( &Truthh, nVars );   //printf( "\n" );
//        Kit_DsdPrintFromTruth( &Truthh, nVars );    printf( "\n" );
    }
//    printf( "\n" );
}